

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec_utils.c
# Opt level: O0

char * apprun_resolve_file_from_path_env(char *filename)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  size_t __n;
  bool bVar4;
  size_t path_len;
  char *itr_end;
  char *itr_begin;
  uint filename_len;
  char *path_env;
  char resolved [4096];
  char search_paths [4096];
  char *filename_local;
  
  memset(resolved + 0xff8,0,0x1000);
  memset(&path_env,0,0x1000);
  pcVar2 = getenv("PATH");
  if (pcVar2 == (char *)0x0) {
    confstr(0,resolved + 0xff8,0x1000);
  }
  else {
    strcpy(resolved + 0xff8,pcVar2);
  }
  sVar3 = strlen(filename);
  itr_end = resolved + 0xff8;
  while( true ) {
    bVar4 = false;
    if (itr_end != (char *)0x0) {
      bVar4 = *itr_end != '\0';
    }
    if (!bVar4) break;
    pcVar2 = strchrnul(itr_end,0x3a);
    __n = (long)pcVar2 - (long)itr_end;
    if (__n != 0) {
      strncpy((char *)&path_env,itr_end,__n);
      resolved[__n - 8] = '/';
      strncpy(resolved + (__n - 7),filename,sVar3 & 0xffffffff);
      resolved[__n + (sVar3 & 0xffffffff) + -7] = '\0';
      iVar1 = access((char *)&path_env,0);
      if (iVar1 == 0) {
        pcVar2 = strdup((char *)&path_env);
        return pcVar2;
      }
      itr_end = pcVar2 + 1;
    }
  }
  pcVar2 = strdup(filename);
  return pcVar2;
}

Assistant:

char* apprun_resolve_file_from_path_env(const char* filename) {
    char search_paths[PATH_MAX] = {0x0};
    char resolved[PATH_MAX] = {0x0};

    // use PATH env or fallback to confstr(_CS_PATH)
    char* path_env = getenv("PATH");
    if (path_env != NULL)
        strcpy(search_paths, path_env);
    else
        confstr(_CS_PATH, search_paths, PATH_MAX);

    unsigned filename_len = strlen(filename);

    char* itr_begin = search_paths;
    char* itr_end = NULL;
    while (itr_begin != NULL && *itr_begin != '\0') {
        itr_end = strchrnul(itr_begin, ':');
        size_t path_len = itr_end - itr_begin;
        if (path_len > 0) {
            strncpy(resolved, itr_begin, path_len);
            resolved[path_len] = '/';
            strncpy(resolved + path_len + 1, filename, filename_len);
            resolved[path_len + filename_len + 1] = '\0';

            if (access(resolved, F_OK) == 0)
                return strdup(resolved);

            itr_begin = itr_end + 1;
        }
    }

    return strdup(filename);
}